

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O2

bool __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::Uint(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
       *this,uint i)

{
  ulong *puVar1;
  
  puVar1 = (ulong *)(this->stack_).stackTop_;
  if ((this->stack_).stackEnd_ <= puVar1 + 3) {
    internal::Stack<rapidjson::CrtAllocator>::
    Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
              (&this->stack_,1);
    puVar1 = (ulong *)(this->stack_).stackTop_;
  }
  (this->stack_).stackTop_ = (char *)(puVar1 + 3);
  puVar1[1] = 0;
  *(undefined4 *)(puVar1 + 2) = 0x3a06;
  *puVar1 = (ulong)i;
  if (-1 < (int)i) {
    *(undefined4 *)(puVar1 + 2) = 0x3e06;
  }
  return true;
}

Assistant:

bool Uint(unsigned i) { new (stack_.template Push<ValueType>()) ValueType(i); return true; }